

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint HuffmanTree_makeFromLengths(HuffmanTree *tree,uint *bitlen,size_t numcodes,uint maxbitlen)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  
  puVar2 = (uint *)malloc(numcodes * 4);
  tree->lengths = puVar2;
  if (puVar2 != (uint *)0x0) {
    if (numcodes != 0) {
      uVar3 = 0;
      do {
        puVar2[uVar3] = bitlen[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uVar3 & 0xffffffff) != numcodes);
    }
    tree->numcodes = (uint)numcodes;
    tree->maxbitlen = maxbitlen;
    uVar1 = HuffmanTree_makeFromLengths2(tree);
    return uVar1;
  }
  return 0x53;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths(HuffmanTree* tree, const unsigned* bitlen,
                                            size_t numcodes, unsigned maxbitlen)
{
  unsigned i;
  tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  for(i = 0; i != numcodes; ++i) tree->lengths[i] = bitlen[i];
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->maxbitlen = maxbitlen;
  return HuffmanTree_makeFromLengths2(tree);
}